

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_any.hpp
# Opt level: O3

bool __thiscall Omega_h::any::is_typed(any *this,type_info *t)

{
  char *__s1;
  int iVar1;
  type_info *ptVar2;
  bool bVar3;
  
  if (this->vtable == (vtable_type *)0x0) {
    ptVar2 = (type_info *)&void::typeinfo;
  }
  else {
    ptVar2 = (*this->vtable->type)();
  }
  __s1 = *(char **)(ptVar2 + 8);
  if (__s1 == *(char **)(t + 8)) {
    bVar3 = true;
  }
  else if (*__s1 == '*') {
    bVar3 = false;
  }
  else {
    iVar1 = strcmp(__s1,*(char **)(t + 8));
    bVar3 = iVar1 == 0;
  }
  return bVar3;
}

Assistant:

bool is_typed(const std::type_info& t) const {
    return is_same(this->type(), t);
  }